

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass
          (RegionRegisterLiveness *this,Instruction *insn)

{
  bool bVar1;
  uint32_t uVar2;
  TypeManager *this_00;
  DecorationManager *this_01;
  RegisterClass reg_class;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  bVar1 = anon_unknown_8::CreatesRegisterUsage(insn);
  if (bVar1) {
    this_00 = IRContext::get_type_mgr(insn->context_);
    uVar2 = Instruction::type_id(insn);
    reg_class.type_ = analysis::TypeManager::GetType(this_00,uVar2);
    reg_class.is_uniform_ = false;
    this_01 = IRContext::get_decoration_mgr(insn->context_);
    uVar2 = Instruction::result_id(insn);
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:274:7)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:274:7)>
               ::_M_manager;
    local_40._M_unused._M_object = &reg_class;
    analysis::DecorationManager::WhileEachDecoration
              (this_01,uVar2,0x1a,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    AddRegisterClass(this,&reg_class);
    return;
  }
  __assert_fail("CreatesRegisterUsage(insn) && \"Instruction does not use a register\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x10a,
                "void spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(Instruction *)"
               );
}

Assistant:

void RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(
    Instruction* insn) {
  assert(CreatesRegisterUsage(insn) && "Instruction does not use a register");
  analysis::Type* type =
      insn->context()->get_type_mgr()->GetType(insn->type_id());

  RegisterLiveness::RegisterClass reg_class{type, false};

  insn->context()->get_decoration_mgr()->WhileEachDecoration(
      insn->result_id(), uint32_t(spv::Decoration::Uniform),
      [&reg_class](const Instruction&) {
        reg_class.is_uniform_ = true;
        return false;
      });

  AddRegisterClass(reg_class);
}